

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

int kvtree_delete(kvtree **ptr_hash)

{
  kvtree *pkVar1;
  kvtree_elem *elem_00;
  kvtree_elem *elem;
  kvtree *hash;
  kvtree **ptr_hash_local;
  
  if ((ptr_hash != (kvtree **)0x0) && (pkVar1 = *ptr_hash, pkVar1 != (kvtree *)0x0)) {
    while (pkVar1->lh_first != (kvtree_elem_struct *)0x0) {
      elem_00 = pkVar1->lh_first;
      if ((elem_00->pointers).le_next != (kvtree_elem_struct *)0x0) {
        (((elem_00->pointers).le_next)->pointers).le_prev = (elem_00->pointers).le_prev;
      }
      *(elem_00->pointers).le_prev = (elem_00->pointers).le_next;
      kvtree_elem_delete(elem_00);
    }
    kvtree_free(ptr_hash);
  }
  return 0;
}

Assistant:

int kvtree_delete(kvtree** ptr_hash)
{
  if (ptr_hash != NULL) {
    kvtree* hash = *ptr_hash;
    if (hash != NULL) {
      while (!LIST_EMPTY(hash)) {
        kvtree_elem* elem = LIST_FIRST(hash);
        LIST_REMOVE(elem, pointers);
        kvtree_elem_delete(elem);
      }
      kvtree_free(ptr_hash);
    }
  }
  return KVTREE_SUCCESS;
}